

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O0

void tinyformat::format<long,long,unsigned_long,std::__cxx11::string>
               (ostream *out,char *fmt,long *args,long *args_1,unsigned_long *args_2,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3)

{
  ostream *in_RSI;
  unsigned_long *in_RDI;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  long local_78 [14];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  makeFormatList<long,long,unsigned_long,std::__cxx11::string>
            (local_78,(long *)in_RSI,in_RDI,in_stack_ffffffffffffff38);
  vformat(in_RSI,(char *)in_RDI,(FormatListRef)in_stack_ffffffffffffff38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void format(std::ostream& out, const char* fmt, const Args&... args)
{
    vformat(out, fmt, makeFormatList(args...));
}